

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::EmitTopLevelEvalFunctionBodyInfo
               (TopLevelEvalFunctionBodyResolveInfo *fbInfo,ThreadContext *threadContext,
               FileWriter *writer,Separator separator)

{
  Separator separator_local;
  FileWriter *writer_local;
  ThreadContext *threadContext_local;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo_local;
  
  EmitTopLevelCommonBodyResolveInfo(&fbInfo->TopLevelBase,true,threadContext,writer,separator);
  FileWriter::WriteUInt64(writer,u64Val,fbInfo->EvalFlags,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(fbInfo->RegisterDocument & 1),1);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(fbInfo->IsIndirect & 1),1);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(fbInfo->IsStrictMode & 1),1);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitTopLevelEvalFunctionBodyInfo(const TopLevelEvalFunctionBodyResolveInfo* fbInfo, ThreadContext* threadContext, FileWriter* writer, NSTokens::Separator separator)
        {
            NSSnapValues::EmitTopLevelCommonBodyResolveInfo(&fbInfo->TopLevelBase, true, threadContext, writer, separator);

            writer->WriteUInt64(NSTokens::Key::u64Val, fbInfo->EvalFlags, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, fbInfo->RegisterDocument, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, fbInfo->IsIndirect, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, fbInfo->IsStrictMode, NSTokens::Separator::CommaSeparator);
            writer->WriteRecordEnd();
        }